

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

size_t __thiscall llvm::StringRef::count(StringRef *this,StringRef Str)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  ulong __n;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  
  __n = Str.Length;
  uVar1 = this->Length;
  if ((uVar1 < __n) || (uVar1 - __n == -1)) {
    sVar6 = 0;
  }
  else {
    pcVar2 = this->Data;
    sVar6 = 0;
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if (uVar1 < uVar4) {
        uVar5 = uVar1;
      }
      if (__n <= uVar1 - uVar5) {
        if (__n == 0) {
          sVar6 = sVar6 + 1;
        }
        else {
          iVar3 = bcmp(pcVar2 + uVar5,Str.Data,__n);
          sVar6 = sVar6 + (iVar3 == 0);
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uVar1 - __n) + 1 != uVar4);
  }
  return sVar6;
}

Assistant:

size_t StringRef::count(StringRef Str) const {
  size_t Count = 0;
  size_t N = Str.size();
  if (N > Length)
    return 0;
  for (size_t i = 0, e = Length - N + 1; i != e; ++i)
    if (substr(i, N).equals(Str))
      ++Count;
  return Count;
}